

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_>
* __thiscall
phmap::priv::
btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>::erase
          (pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_>
           *__return_storage_ptr__,
          btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          *this,iterator _begin,iterator _end)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  unsigned_long *puVar4;
  iterator iVar5;
  iterator _begin_00;
  iterator iter;
  iterator iter_00;
  iterator _end_00;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
  __last;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
  __first;
  unsigned_long local_f0;
  size_type remaining_in_node;
  size_type remaining_to_erase;
  size_type target_size;
  int local_d0;
  int local_c8;
  undefined4 uStack_c4;
  int iStack_c0;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
  local_b8;
  btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *local_a8;
  int iStack_a0;
  int local_98;
  undefined4 uStack_94;
  int iStack_90;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *local_80;
  int local_78;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
  local_70;
  int local_5c;
  btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *local_58;
  int local_50;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *local_48;
  int local_40;
  size_type local_38;
  difference_type count;
  btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *this_local;
  iterator _end_local;
  iterator _begin_local;
  
  local_58 = (btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
              *)_end.node;
  local_48 = _begin.node;
  _begin_local.node._0_4_ = _begin.position;
  local_50 = _end.position;
  __last._12_4_ = 0;
  __last.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                 *)SUB128(_end._0_12_,0);
  __last.position = SUB124(_end._0_12_,8);
  __first._12_4_ = 0;
  __first.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                  *)SUB128(_begin._0_12_,0);
  __first.position = SUB124(_begin._0_12_,8);
  local_40 = (int)_begin_local.node;
  count = (difference_type)this;
  this_local = local_58;
  _end_local.node._0_4_ = local_50;
  _end_local._8_8_ = local_48;
  local_38 = std::
             distance<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>,long&,long*>>
                       (__first,__last);
  if ((long)local_38 < 0) {
    __assert_fail("count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xac4,
                  "std::pair<size_type, iterator> phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>>::erase(iterator, iterator) [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>]"
                 );
  }
  if (local_38 == 0) {
    local_5c = 0;
    std::
    pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_>
    ::
    pair<int,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_&,_true>
              (__return_storage_ptr__,&local_5c,
               (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
                *)&_end_local.position);
  }
  else if (local_38 == this->size_) {
    clear(this);
    iVar5 = end(this);
    local_80 = iVar5.node;
    local_78 = iVar5.position;
    local_70.node = local_80;
    local_70.position = local_78;
    std::
    pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_>
    ::
    pair<long_&,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>,_true>
              (__return_storage_ptr__,(long *)&local_38,&local_70);
  }
  else if ((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
            *)_end_local._8_8_ == this_local) {
    local_98 = _end_local.position;
    uStack_94 = _end_local._12_4_;
    local_a8 = this_local;
    iStack_a0 = (int)_end_local.node;
    _begin_00.position = (int)_begin_local.node;
    _begin_00.node =
         (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          *)_end_local._8_8_;
    _end_00.position = (int)_end_local.node;
    _end_00.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                    *)this_local;
    _begin_00._12_4_ = 0;
    _end_00._12_4_ = 0;
    iStack_90 = (int)_begin_local.node;
    erase_same_node(this,_begin_00,_end_00);
    this->size_ = this->size_ - local_38;
    local_c8 = _end_local.position;
    uStack_c4 = _end_local._12_4_;
    iter.position = (int)_begin_local.node;
    iter.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                 *)_end_local._8_8_;
    iter._12_4_ = 0;
    iStack_c0 = (int)_begin_local.node;
    iVar5 = rebalance_after_delete(this,iter);
    target_size = (size_type)iVar5.node;
    local_d0 = iVar5.position;
    local_b8.node =
         (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          *)target_size;
    local_b8.position = local_d0;
    std::
    pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_>
    ::
    pair<long_&,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>,_true>
              (__return_storage_ptr__,(long *)&local_38,&local_b8);
  }
  else {
    remaining_to_erase = this->size_ - local_38;
    while (remaining_to_erase < this->size_) {
      bVar2 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
              ::leaf((btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                      *)_end_local._8_8_);
      if (bVar2) {
        remaining_in_node = this->size_ - remaining_to_erase;
        bVar3 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                ::count((btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                         *)_end_local._8_8_);
        uVar1 = _end_local._8_8_;
        local_f0 = (unsigned_long)(int)((uint)bVar3 - (int)_begin_local.node);
        puVar4 = std::min<unsigned_long>(&remaining_in_node,&local_f0);
        iVar5.position = (int)_begin_local.node;
        iVar5.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                      *)uVar1;
        iVar5._12_4_ = 0;
        iVar5 = erase_from_leaf_node(this,iVar5,*puVar4);
        _end_local._8_8_ = iVar5.node;
        _begin_local.node._0_4_ = iVar5.position;
      }
      else {
        iter_00.position = (int)_begin_local.node;
        iter_00.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                        *)_end_local._8_8_;
        iter_00._12_4_ = 0;
        iVar5 = erase(this,iter_00);
        _end_local._8_8_ = iVar5.node;
        _begin_local.node._0_4_ = iVar5.position;
      }
    }
    std::
    pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_>
    ::
    pair<long_&,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_&,_true>
              (__return_storage_ptr__,(long *)&local_38,
               (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
                *)&_end_local.position);
  }
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::erase(iterator _begin, iterator _end)
        -> std::pair<size_type, iterator> {
        difference_type count = std::distance(_begin, _end);
        assert(count >= 0);

        if (count == 0) {
            return {0, _begin};
        }

        if (count == (difference_type)size_) {
            clear();
            return {count, this->end()};
        }

        if (_begin.node == _end.node) {
            erase_same_node(_begin, _end);
            size_ -= count;
            return {count, rebalance_after_delete(_begin)};
        }

        const size_type target_size = size_ - count;
        while (size_ > target_size) {
            if (_begin.node->leaf()) {
                const size_type remaining_to_erase = size_ - target_size;
                const size_type remaining_in_node = _begin.node->count() - _begin.position;
                _begin = erase_from_leaf_node(
                    _begin, (std::min)(remaining_to_erase, remaining_in_node));
            } else {
                _begin = erase(_begin);
            }
        }
        return {count, _begin};
    }